

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_long>::Add
          (RepeatedFieldWrapper<unsigned_long> *this,Field *data,Value *value)

{
  int iVar1;
  RepeatedFieldType *this_00;
  undefined4 extraout_var;
  unsigned_long local_28;
  Value *local_20;
  Value *value_local;
  Field *data_local;
  RepeatedFieldWrapper<unsigned_long> *this_local;
  
  local_20 = value;
  value_local = data;
  data_local = this;
  this_00 = MutableRepeatedField(data);
  iVar1 = (*(this->super_RandomAccessRepeatedFieldAccessor).super_RepeatedFieldAccessor.
            _vptr_RepeatedFieldAccessor[0x10])(this,local_20);
  local_28 = CONCAT44(extraout_var,iVar1);
  RepeatedField<unsigned_long>::Add(this_00,&local_28);
  return;
}

Assistant:

void Add(Field* data, const Value* value) const override {
    MutableRepeatedField(data)->Add(ConvertToT(value));
  }